

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP256_SHA512.c
# Opt level: O0

uint32_t Hacl_HPKE_Curve51_CP256_SHA512_openBase
                   (uint8_t *pkE,uint8_t *skR,uint32_t infolen,uint8_t *info,uint32_t aadlen,
                   uint8_t *aad,uint32_t ctlen,uint8_t *ct,uint8_t *o_pt)

{
  Hacl_Impl_HPKE_context_s o_ctx_00;
  uint32_t uVar1;
  __uint64_t i_00;
  uint64_t s_;
  uint64_t s1;
  uint32_t res1;
  uint8_t *tag;
  uint8_t *cipher;
  uint8_t yi_11;
  uint8_t xi_11;
  uint8_t yi_10;
  uint8_t xi_10;
  uint8_t yi_9;
  uint8_t xi_9;
  uint8_t yi_8;
  uint8_t xi_8;
  uint8_t yi_7;
  uint8_t xi_7;
  uint8_t yi_6;
  uint8_t xi_6;
  uint8_t yi_5;
  uint8_t xi_5;
  uint8_t yi_4;
  uint8_t xi_4;
  uint8_t yi_3;
  uint8_t xi_3;
  uint8_t yi_2;
  uint8_t xi_2;
  uint8_t yi_1;
  uint8_t xi_1;
  uint8_t yi;
  uint8_t xi;
  uint32_t i;
  uint8_t enc [12];
  uint64_t s;
  uint8_t nonce [12];
  uint32_t res;
  Hacl_Impl_HPKE_context_s o_ctx;
  uint8_t ctx_exporter [64];
  uint8_t local_80 [8];
  uint64_t ctx_seq;
  uint8_t ctx_nonce [12];
  uint8_t ctx_key [32];
  uint8_t *aad_local;
  uint32_t aadlen_local;
  uint8_t *info_local;
  uint32_t infolen_local;
  uint8_t *skR_local;
  uint8_t *pkE_local;
  
  memset(ctx_nonce + 4,0,0x20);
  memset((void *)((long)&ctx_seq + 4),0,0xc);
  local_80[0] = '\0';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  memset(&o_ctx.ctx_exporter,0,0x40);
  unique0x00004780 = ctx_nonce + 4;
  o_ctx.ctx_key = (uint8_t *)((long)&ctx_seq + 4);
  o_ctx.ctx_nonce = local_80;
  o_ctx.ctx_seq = (uint64_t *)&o_ctx.ctx_exporter;
  o_ctx_00.ctx_nonce = o_ctx.ctx_key;
  o_ctx_00.ctx_key = unique0x00004780;
  o_ctx_00.ctx_seq = (uint64_t *)o_ctx.ctx_nonce;
  o_ctx_00.ctx_exporter = (uint8_t *)o_ctx.ctx_seq;
  nonce._4_4_ = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx_00,pkE,skR,infolen,info);
  if (nonce._4_4_ == 0) {
    memset(&s,0,0xc);
    enc._4_8_ = *(undefined8 *)o_ctx.ctx_nonce;
    memset(&yi_1,0,0xc);
    i_00 = __bswap_64(enc._4_8_);
    store64((uint8_t *)&i,i_00);
    s._0_1_ = yi_1 ^ *o_ctx.ctx_key;
    s._1_1_ = xi_1 ^ o_ctx.ctx_key[1];
    s._2_1_ = yi ^ o_ctx.ctx_key[2];
    s._3_1_ = xi ^ o_ctx.ctx_key[3];
    s._4_1_ = (byte)i ^ o_ctx.ctx_key[4];
    s._5_1_ = i._1_1_ ^ o_ctx.ctx_key[5];
    s._6_1_ = i._2_1_ ^ o_ctx.ctx_key[6];
    s._7_1_ = i._3_1_ ^ o_ctx.ctx_key[7];
    nonce[0] = enc[0] ^ o_ctx.ctx_key[8];
    nonce[1] = enc[1] ^ o_ctx.ctx_key[9];
    nonce[2] = enc[2] ^ o_ctx.ctx_key[10];
    nonce[3] = enc[3] ^ o_ctx.ctx_key[0xb];
    uVar1 = Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt
                      (o_pt,ct,ctlen - 0x10,aad,aadlen,stack0xffffffffffffff18,(uint8_t *)&s,
                       ct + ((ulong)ctlen - 0x10));
    if (uVar1 == 0) {
      if (*(long *)o_ctx.ctx_nonce == -1) {
        pkE_local._4_4_ = 1;
      }
      else {
        *(long *)o_ctx.ctx_nonce = *(long *)o_ctx.ctx_nonce + 1;
        pkE_local._4_4_ = 0;
      }
    }
    else {
      pkE_local._4_4_ = 1;
    }
  }
  else {
    pkE_local._4_4_ = 1;
  }
  return pkE_local._4_4_;
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP256_SHA512_openBase(
  uint8_t *pkE,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info,
  uint32_t aadlen,
  uint8_t *aad,
  uint32_t ctlen,
  uint8_t *ct,
  uint8_t *o_pt
)
{
  uint8_t ctx_key[32U] = { 0U };
  uint8_t ctx_nonce[12U] = { 0U };
  uint64_t ctx_seq = 0ULL;
  uint8_t ctx_exporter[64U] = { 0U };
  Hacl_Impl_HPKE_context_s
  o_ctx =
    {
      .ctx_key = ctx_key,
      .ctx_nonce = ctx_nonce,
      .ctx_seq = &ctx_seq,
      .ctx_exporter = ctx_exporter
    };
  uint32_t res = Hacl_HPKE_Curve51_CP256_SHA512_setupBaseR(o_ctx, pkE, skR, infolen, info);
  if (res == 0U)
  {
    uint8_t nonce[12U] = { 0U };
    uint64_t s = o_ctx.ctx_seq[0U];
    uint8_t enc[12U] = { 0U };
    store64_be(enc + 4U, s);
    KRML_MAYBE_FOR12(i,
      0U,
      12U,
      1U,
      uint8_t xi = enc[i];
      uint8_t yi = o_ctx.ctx_nonce[i];
      nonce[i] = (uint32_t)xi ^ (uint32_t)yi;);
    uint8_t *cipher = ct;
    uint8_t *tag = ct + ctlen - 16U;
    uint32_t
    res1 =
      Hacl_AEAD_Chacha20Poly1305_Simd256_decrypt(o_pt,
        cipher,
        ctlen - 16U,
        aad,
        aadlen,
        o_ctx.ctx_key,
        nonce,
        tag);
    if (res1 == 0U)
    {
      uint64_t s1 = o_ctx.ctx_seq[0U];
      if (s1 == 18446744073709551615ULL)
      {
        return 1U;
      }
      uint64_t s_ = s1 + 1ULL;
      o_ctx.ctx_seq[0U] = s_;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}